

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::ApplicationInfoFilter::Impl::should_record_immutable_samplers
          (Impl *this,VkApplicationInfo *info)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  _Var1;
  allocator local_49;
  key_type local_48;
  
  if (info == (VkApplicationInfo *)0x0) {
    return true;
  }
  if (info->pApplicationName != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_48,info->pApplicationName,&local_49);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->application_infos)._M_h,&local_48);
    std::__cxx11::string::_M_dispose();
    if (_Var1._M_cur != (__node_type *)0x0) goto LAB_0015c201;
  }
  if (info->pEngineName == (char *)0x0) {
    return true;
  }
  std::__cxx11::string::string((string *)&local_48,info->pEngineName,&local_49);
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->engine_infos)._M_h,&local_48);
  std::__cxx11::string::_M_dispose();
  if (_Var1._M_cur == (__node_type *)0x0) {
    return true;
  }
LAB_0015c201:
  return (bool)((_Var1._M_cur)->
               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
               ._M_storage._M_storage.__data[0x2c];
}

Assistant:

bool ApplicationInfoFilter::Impl::should_record_immutable_samplers(const VkApplicationInfo *info)
{
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
			return itr->second.record_immutable_samplers;
	}

	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
			return itr->second.record_immutable_samplers;
	}

	return true;
}